

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall CConnman::GetExtraBlockRelayCount(CConnman *this)

{
  pointer ppCVar1;
  CNode *pCVar2;
  pointer ppCVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock74;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  ppCVar3 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar5 = 0;
  if (ppCVar3 != ppCVar1) {
    iVar5 = 0;
    do {
      pCVar2 = *ppCVar3;
      if ((((pCVar2->fSuccessfullyConnected)._M_base._M_i & 1U) != 0) &&
         (((pCVar2->fDisconnect)._M_base._M_i & 1U) == 0)) {
        iVar5 = iVar5 + (uint)(pCVar2->m_conn_type == BLOCK_RELAY);
      }
      ppCVar3 = ppCVar3 + 1;
    } while (ppCVar3 != ppCVar1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  iVar5 = iVar5 - this->m_max_outbound_block_relay;
  iVar4 = 0;
  if (0 < iVar5) {
    iVar4 = iVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int CConnman::GetExtraBlockRelayCount() const
{
    int block_relay_peers = 0;
    {
        LOCK(m_nodes_mutex);
        for (const CNode* pnode : m_nodes) {
            if (pnode->fSuccessfullyConnected && !pnode->fDisconnect && pnode->IsBlockOnlyConn()) {
                ++block_relay_peers;
            }
        }
    }
    return std::max(block_relay_peers - m_max_outbound_block_relay, 0);
}